

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O3

ssize_t amqp_tcp_socket_recv(void *base,void *buf,size_t len,int flags)

{
  int iVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  amqp_tcp_socket_t *self;
  
  if (*(int *)((long)base + 8) == -1) {
    return -0x11;
  }
  do {
    sVar2 = recv(*(int *)((long)base + 8),buf,len,flags);
    if (-1 < sVar2) {
      if (sVar2 != 0) {
        return sVar2;
      }
      return -7;
    }
    iVar1 = amqp_os_socket_error();
    *(int *)((long)base + 0xc) = iVar1;
  } while (iVar1 == 4);
  if (iVar1 == 0xb) {
    sVar3 = -0x1301;
  }
  else {
    sVar3 = -9;
  }
  return sVar3;
}

Assistant:

static ssize_t amqp_tcp_socket_recv(void *base, void *buf, size_t len,
                                    int flags) {
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  ssize_t ret;
  if (-1 == self->sockfd) {
    return AMQP_STATUS_SOCKET_CLOSED;
  }

start:
#ifdef _WIN32
  ret = recv(self->sockfd, buf, (int)len, flags);
#else
  ret = recv(self->sockfd, buf, len, flags);
#endif

  if (0 > ret) {
    self->internal_error = amqp_os_socket_error();
    switch (self->internal_error) {
      case EINTR:
        goto start;
#ifdef _WIN32
      case WSAEWOULDBLOCK:
#else
      case EWOULDBLOCK:
#endif
#if defined(EAGAIN) && EAGAIN != EWOULDBLOCK
      case EAGAIN:
#endif
        ret = AMQP_PRIVATE_STATUS_SOCKET_NEEDREAD;
        break;
      default:
        ret = AMQP_STATUS_SOCKET_ERROR;
    }
  } else if (0 == ret) {
    ret = AMQP_STATUS_CONNECTION_CLOSED;
  }

  return ret;
}